

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O3

ggml_tensor * __thiscall callback_data::filter_nonzero_rows(callback_data *this,ggml_tensor *a)

{
  undefined4 uVar1;
  ggml_tensor *pgVar2;
  size_t __size;
  void *pvVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  float fVar9;
  vector<int,_std::allocator<int>_> rows_to_copy;
  int local_5c;
  void *local_58;
  iterator iStack_50;
  int *local_48;
  callback_data *local_38;
  
  local_58 = (void *)0x0;
  iStack_50._M_current = (int *)0x0;
  local_48 = (int *)0x0;
  local_5c = 0;
  local_38 = this;
  if (0 < a->ne[1]) {
    uVar6 = 0;
    do {
      iVar5 = (int)a->ne[0];
      if (0 < iVar5) {
        bVar7 = false;
        iVar4 = 0;
        do {
          fVar9 = (float)ggml_get_f32_nd(a,iVar4,uVar6 & 0xffffffff,0,0);
          if (1e-06 < fVar9) break;
          iVar4 = iVar4 + 1;
          bVar7 = iVar5 <= iVar4;
        } while (iVar4 != iVar5);
        if (!bVar7) {
          if (iStack_50._M_current == local_48) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_5c);
          }
          else {
            *iStack_50._M_current = local_5c;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
      uVar6 = (long)local_5c + 1;
      local_5c = (int)uVar6;
    } while ((long)uVar6 < a->ne[1]);
    uVar8 = (uint)((long)iStack_50._M_current - (long)local_58 >> 2);
    if (0 < (int)uVar8) {
      iVar5 = (int)a->ne[0];
      pgVar2 = (ggml_tensor *)
               ggml_new_tensor_2d(local_38->ctx_ggml,0,(long)iVar5,uVar8 & 0x7fffffff);
      ggml_format_name(pgVar2,"diff_filtered_%s",a->name);
      __size = ggml_nbytes(pgVar2);
      pvVar3 = malloc(__size);
      pgVar2->data = pvVar3;
      local_38 = (callback_data *)(ulong)(uVar8 & 0x7fffffff);
      uVar6 = 0;
      do {
        if (0 < iVar5) {
          uVar1 = *(undefined4 *)((long)local_58 + uVar6 * 4);
          iVar4 = 0;
          do {
            ggml_get_f32_nd(a,iVar4,uVar1,0,0);
            ggml_set_f32_nd(pgVar2,iVar4,uVar6 & 0xffffffff);
            iVar4 = iVar4 + 1;
          } while (iVar5 != iVar4);
        }
        uVar6 = uVar6 + 1;
      } while ((callback_data *)uVar6 != local_38);
      if (local_58 != (void *)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
      return pgVar2;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
             ,0x8a,"GGML_ASSERT(%s) failed","n_nonzero_rows > 0");
}

Assistant:

struct ggml_tensor * filter_nonzero_rows(struct ggml_tensor * a) {
        //printf("filter_nonzero_rows\n");
        auto is_row_all_zeros = [](struct ggml_tensor * t, int row, float eps) -> bool {
            // check if given row containing all zero elements
            int n_cols = t->ne[0]; // hint: should be equal to n_embd
            for (int col = 0; col < n_cols; ++col) {
                if (ggml_get_f32_nd(t, col, row, 0, 0) > eps) {
                    return false;
                }
            }
            return true;
        };
        std::vector<int> rows_to_copy; // the idx of non-zero cols (to be copied to row of diff_filtered)
        for (int i_row = 0; i_row < a->ne[1]; i_row++) {
            if (!is_row_all_zeros(a, i_row, 1e-6)) {
                rows_to_copy.push_back(i_row);
            }
        }

        // get "n_nonzero_rows" for the output "diff_filtered"
        int n_nonzero_rows = rows_to_copy.size();
        //printf("n_nonzero_rows: %d\n", n_nonzero_rows);
        int n_embd = a->ne[0];
        GGML_ASSERT(n_nonzero_rows > 0);

        // diff_filtered: [n_embd, n_nonzero_rows]
        struct ggml_tensor * diff_filtered = ggml_new_tensor_2d(
            ctx_ggml, GGML_TYPE_F32, n_embd, n_nonzero_rows);
        ggml_format_name(diff_filtered, "diff_filtered_%s", a->name);
        diff_filtered->data = malloc(ggml_nbytes(diff_filtered));

        // copy non-zero rows
        for (int dest_row = 0; dest_row < n_nonzero_rows; dest_row++) {
            int src_row = rows_to_copy[dest_row];
            for (int i = 0; i < n_embd; i++) {
                float src_elem = ggml_get_f32_nd(a, i, src_row, 0, 0);
                ggml_set_f32_nd(diff_filtered, i, dest_row, 0, 0, src_elem);
            }
        }

        //print_debug_tensor(diff_filtered);

        return diff_filtered;
    }